

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

vector3d * tinyusdz::transform(vector3d *__return_storage_ptr__,matrix4d *m,vector3d *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  vector3d *in_RCX;
  vector3d tx;
  vector3d *p_local;
  matrix4d *m_local;
  
  dVar1 = m->m[3][0];
  dVar2 = m->m[3][1];
  dVar3 = m->m[3][2];
  value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::vector3d,double,double,3ul>
            (__return_storage_ptr__,(value *)m,(matrix4d *)p,in_RCX);
  __return_storage_ptr__->x = dVar1 + __return_storage_ptr__->x;
  __return_storage_ptr__->y = dVar2 + __return_storage_ptr__->y;
  __return_storage_ptr__->z = dVar3 + __return_storage_ptr__->z;
  return __return_storage_ptr__;
}

Assistant:

value::vector3d transform(const value::matrix4d &m, const value::vector3d &p) {
  value::vector3d tx{m.m[3][0], m.m[3][1], m.m[3][2]};
  value::vector3d v =
      value::MultV<value::matrix4d, value::vector3d, double, double, 3>(m, p);
  v.x += tx.x;
  v.y += tx.y;
  v.z += tx.z;
  return v;
}